

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::rehash
          (SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *this)

{
  uint uVar1;
  Node *pNVar2;
  Allocator *pAVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Node *pNVar6;
  Node *item;
  ulong uVar7;
  InplaceStr local_38;
  
  uVar1 = this->bucketCount;
  uVar7 = (ulong)uVar1;
  pNVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    pNVar6 = (Node *)(*(code *)NULLC::alloc)(uVar1 * 0x30);
  }
  else {
    iVar5 = (*this->allocator->_vptr_Allocator[2])();
    pNVar6 = (Node *)CONCAT44(extraout_var,iVar5);
  }
  this->data = pNVar6;
  NULLC::fillMemory(pNVar6,0,(ulong)this->bucketCount * 0x18);
  this->count = 0;
  pNVar6 = pNVar2;
  for (; uVar7 != 0; uVar7 = uVar7 - 1) {
    local_38.begin = (char *)0x0;
    local_38.end = (char *)0x0;
    bVar4 = InplaceStr::operator==(&pNVar6->key,&local_38);
    if (!bVar4) {
      insert(this,&pNVar6->key,&pNVar6->value);
    }
    pNVar6 = pNVar6 + 1;
  }
  if (pNVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pNVar2);
    }
    else {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,pNVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		else
			data = (Node*)NULLC::alloc(sizeof(Node) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node &item = oldData[i];

			if(item.key == Key())
				continue;

			insert(item.key, item.value);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}